

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_type.hpp
# Opt level: O0

void __thiscall
pstore::brokerface::message_type::
message_type<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (message_type *this,uint32_t mid,uint16_t pno,uint16_t nump,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  undefined6 in_register_0000000a;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_00;
  uint16_t nump_local;
  uint16_t pno_local;
  uint32_t mid_local;
  message_type *this_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first_local;
  
  last_00._M_current._2_6_ = in_register_0000000a;
  last_00._M_current._0_2_ = pno;
  this->sender_id = process_id;
  this->message_id = mid;
  this->part_no = pno;
  this->num_parts = nump;
  get_payload<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&this->payload,(message_type *)first._M_current,last,last_00);
  if (this->num_parts <= this->part_no) {
    raise<pstore::error_code>(bad_message_part_number);
  }
  return;
}

Assistant:

message_type (std::uint32_t const mid, std::uint16_t const pno,
                          std::uint16_t const nump, InputIterator first, InputIterator last)
                    : sender_id{process_id}
                    , message_id{mid}
                    , part_no{pno}
                    , num_parts{nump}
                    , payload (get_payload (first, last)) {

                if (part_no >= num_parts) {
                    raise (::pstore::error_code::bad_message_part_number);
                }
            }